

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O0

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFullName_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  string_view view;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  FrameworkDescriptor *local_18;
  FrameworkDescriptor *this_local;
  
  local_18 = this;
  this_local = (FrameworkDescriptor *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_48,&this->Name);
  view = (string_view)::cm::operator____s(".framework/",0xb);
  cmAlphaNum::cmAlphaNum(&local_78,view);
  cmStrCat<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,&local_48,&local_78,&this->Name,&this->Suffix);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullName() const
    {
      return cmStrCat(this->Name, ".framework/"_s, this->Name, this->Suffix);
    }